

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlTestReporter.cpp
# Opt level: O2

void __thiscall
UnitTest::XmlTestReporter::BeginResults
          (XmlTestReporter *this,ostream *os,int totalTestCount,int failedTestCount,int failureCount
          ,float secondsElapsed)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,"<unittest-results");
  poVar1 = std::operator<<(poVar1," tests=\"");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,totalTestCount);
  poVar1 = std::operator<<(poVar1,"\"");
  poVar1 = std::operator<<(poVar1," failedtests=\"");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,failedTestCount);
  poVar1 = std::operator<<(poVar1,"\"");
  poVar1 = std::operator<<(poVar1," failures=\"");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,failureCount);
  poVar1 = std::operator<<(poVar1,"\"");
  poVar1 = std::operator<<(poVar1," time=\"");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,secondsElapsed);
  poVar1 = std::operator<<(poVar1,"\"");
  std::operator<<(poVar1,">");
  return;
}

Assistant:

void XmlTestReporter::BeginResults(std::ostream& os, int totalTestCount, int failedTestCount, 
                                   int failureCount, float secondsElapsed)
{
   os << "<unittest-results"
       << " tests=\"" << totalTestCount << "\"" 
       << " failedtests=\"" << failedTestCount << "\"" 
       << " failures=\"" << failureCount << "\"" 
       << " time=\"" << secondsElapsed << "\""
       << ">";
}